

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::DeadBranchElimPass::SwitchHasNestedBreak
          (DeadBranchElimPass *this,uint32_t switch_header_id)

{
  IRContext *this_00;
  StructuredCFGAnalysis *pSVar1;
  DefUseManager *this_01;
  bool bVar2;
  uint32_t id;
  Analysis AVar3;
  BasicBlock *this_02;
  IRContext *this_03;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this_02 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,switch_header_id);
  id = BasicBlock::MergeBlockIdIfAny(this_02);
  this_00 = (this->super_MemPass).super_Pass.context_;
  AVar3 = this_00->valid_analyses_;
  this_03 = this_00;
  if ((AVar3 >> 0xb & 1) == 0) {
    IRContext::BuildStructuredCFGAnalysis(this_00);
    this_03 = (this->super_MemPass).super_Pass.context_;
    AVar3 = this_03->valid_analyses_;
  }
  pSVar1 = (this_00->struct_cfg_analysis_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
           .super__Head_base<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_false>._M_head_impl;
  if ((AVar3 & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_03);
  }
  this_01 = (this_03->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = operator_new(0x18);
  *(DeadBranchElimPass **)local_50._M_unused._0_8_ = this;
  *(StructuredCFGAnalysis **)((long)local_50._M_unused._0_8_ + 8) = pSVar1;
  *(uint32_t *)((long)local_50._M_unused._0_8_ + 0x10) = switch_header_id;
  local_38 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:636:7)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:636:7)>
             ::_M_manager;
  bVar2 = analysis::DefUseManager::WhileEachUser
                    (this_01,id,(function<bool_(spvtools::opt::Instruction_*)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return !bVar2;
}

Assistant:

bool DeadBranchElimPass::SwitchHasNestedBreak(uint32_t switch_header_id) {
  std::vector<BasicBlock*> block_in_construct;
  BasicBlock* start_block = context()->get_instr_block(switch_header_id);
  uint32_t merge_block_id = start_block->MergeBlockIdIfAny();

  StructuredCFGAnalysis* cfg_analysis = context()->GetStructuredCFGAnalysis();
  return !get_def_use_mgr()->WhileEachUser(
      merge_block_id,
      [this, cfg_analysis, switch_header_id](Instruction* inst) {
        if (!inst->IsBranch()) {
          return true;
        }

        BasicBlock* bb = context()->get_instr_block(inst);
        if (bb->id() == switch_header_id) {
          return true;
        }
        return (cfg_analysis->ContainingConstruct(inst) == switch_header_id &&
                bb->GetMergeInst() == nullptr);
      });
}